

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O1

void __thiscall ins::LLogMessage::~LLogMessage(LLogMessage *this)

{
  LLog *pLVar1;
  undefined8 *puVar2;
  char local_30;
  undefined7 uStack_2f;
  size_t local_28;
  undefined1 local_20 [16];
  
  local_30 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_30,1);
  pLVar1 = LLog::Instance();
  std::__cxx11::stringbuf::str();
  if (log_to_stderr == '\0') {
    puVar2 = (undefined8 *)&stdout;
  }
  else {
    puVar2 = (undefined8 *)&stderr;
  }
  fwrite((void *)CONCAT71(uStack_2f,local_30),1,local_28,(FILE *)*puVar2);
  if ((FILE *)pLVar1->log_file_ != (FILE *)0x0) {
    fwrite((void *)CONCAT71(uStack_2f,local_30),1,local_28,(FILE *)pLVar1->log_file_);
    fflush((FILE *)pLVar1->log_file_);
  }
  if ((undefined1 *)CONCAT71(uStack_2f,local_30) != local_20) {
    operator_delete((undefined1 *)CONCAT71(uStack_2f,local_30));
  }
  if (this->fatal_ != true) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::ios_base::~ios_base((ios_base *)&this->field_0x70);
    return;
  }
  exit(1);
}

Assistant:

LLogMessage::~LLogMessage() {
  oss_ << '\n';
  LLog::Instance() << oss_.str();
  if (fatal_) {
#if _WIN32
    system("pause");
#endif // _WIN32
    exit(EXIT_FAILURE);
  }
}